

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void md5_do_block(uint32_t *core,uint8_t *block)

{
  uint uVar1;
  uint32_t uVar2;
  ulong local_98;
  size_t u_3;
  size_t u_2;
  size_t u_1;
  size_t u;
  size_t t;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  size_t i;
  uint32_t message_words [16];
  uint8_t *block_local;
  uint32_t *core_local;
  
  message_words._56_8_ = block;
  for (_b = 0; _b < 0x10; _b = _b + 1) {
    uVar2 = GET_32BIT_LSB_FIRST((void *)(message_words._56_8_ + _b * 4));
    message_words[_b - 2] = uVar2;
  }
  c = *core;
  d = core[1];
  t._4_4_ = core[2];
  t._0_4_ = core[3];
  u = 0;
  for (u_1 = 0; u_1 < 4; u_1 = u_1 + 1) {
    uVar1 = (uint)u;
    md5_round(uVar1,(uint32_t *)&i,&c,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,F);
    md5_round(uVar1 + 1,(uint32_t *)&i,(uint32_t *)&t,&c,&d,(uint32_t *)((long)&t + 4),F);
    md5_round(uVar1 + 2,(uint32_t *)&i,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,F);
    u = u + 4;
    md5_round(uVar1 + 3,(uint32_t *)&i,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,F);
  }
  for (u_2 = 0; u_2 < 4; u_2 = u_2 + 1) {
    uVar1 = (uint)u;
    md5_round(uVar1,(uint32_t *)&i,&c,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,G);
    md5_round(uVar1 + 1,(uint32_t *)&i,(uint32_t *)&t,&c,&d,(uint32_t *)((long)&t + 4),G);
    md5_round(uVar1 + 2,(uint32_t *)&i,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,G);
    u = u + 4;
    md5_round(uVar1 + 3,(uint32_t *)&i,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,G);
  }
  for (u_3 = 0; u_3 < 4; u_3 = u_3 + 1) {
    uVar1 = (uint)u;
    md5_round(uVar1,(uint32_t *)&i,&c,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,H);
    md5_round(uVar1 + 1,(uint32_t *)&i,(uint32_t *)&t,&c,&d,(uint32_t *)((long)&t + 4),H);
    md5_round(uVar1 + 2,(uint32_t *)&i,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,H);
    u = u + 4;
    md5_round(uVar1 + 3,(uint32_t *)&i,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,H);
  }
  for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
    uVar1 = (uint)u;
    md5_round(uVar1,(uint32_t *)&i,&c,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,I);
    md5_round(uVar1 + 1,(uint32_t *)&i,(uint32_t *)&t,&c,&d,(uint32_t *)((long)&t + 4),I);
    md5_round(uVar1 + 2,(uint32_t *)&i,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,I);
    u = u + 4;
    md5_round(uVar1 + 3,(uint32_t *)&i,&d,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,I);
  }
  *core = c + *core;
  core[1] = d + core[1];
  core[2] = t._4_4_ + core[2];
  core[3] = (uint32_t)t + core[3];
  smemclr(&i,0x40);
  return;
}

Assistant:

static void md5_do_block(uint32_t *core, const uint8_t *block)
{
    uint32_t message_words[16];
    for (size_t i = 0; i < 16; i++)
        message_words[i] = GET_32BIT_LSB_FIRST(block + 4*i);

    uint32_t a = core[0], b = core[1], c = core[2], d = core[3];

    size_t t = 0;
    for (size_t u = 0; u < 4; u++) {
        md5_round(t++, message_words, &a, &b, &c, &d, F);
        md5_round(t++, message_words, &d, &a, &b, &c, F);
        md5_round(t++, message_words, &c, &d, &a, &b, F);
        md5_round(t++, message_words, &b, &c, &d, &a, F);
    }
    for (size_t u = 0; u < 4; u++) {
        md5_round(t++, message_words, &a, &b, &c, &d, G);
        md5_round(t++, message_words, &d, &a, &b, &c, G);
        md5_round(t++, message_words, &c, &d, &a, &b, G);
        md5_round(t++, message_words, &b, &c, &d, &a, G);
    }
    for (size_t u = 0; u < 4; u++) {
        md5_round(t++, message_words, &a, &b, &c, &d, H);
        md5_round(t++, message_words, &d, &a, &b, &c, H);
        md5_round(t++, message_words, &c, &d, &a, &b, H);
        md5_round(t++, message_words, &b, &c, &d, &a, H);
    }
    for (size_t u = 0; u < 4; u++) {
        md5_round(t++, message_words, &a, &b, &c, &d, I);
        md5_round(t++, message_words, &d, &a, &b, &c, I);
        md5_round(t++, message_words, &c, &d, &a, &b, I);
        md5_round(t++, message_words, &b, &c, &d, &a, I);
    }

    core[0] += a;
    core[1] += b;
    core[2] += c;
    core[3] += d;

    smemclr(message_words, sizeof(message_words));
}